

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_asub_s_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  short sVar6;
  
  lVar2 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar3 = (ulong)wt * 0x10;
  iVar5 = (int)*(short *)((env->active_fpu).fpr + ws) - (int)*(short *)((env->active_fpu).fpr + wt);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((env->active_fpu).fpr + wd) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 2) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 2);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 2) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 4) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 4);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 4) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 6) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 6);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 6) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 8) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 8);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 8) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 10) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 10);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 10) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 0xc) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = sVar6;
  iVar5 = (int)*(short *)((long)(env->active_fpu).fpr + lVar4 + 0xe) -
          (int)*(short *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  sVar1 = (short)iVar5;
  sVar6 = -sVar1;
  if (0 < iVar5) {
    sVar6 = sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = sVar6;
  return;
}

Assistant:

void helper_msa_asub_s_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_asub_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_asub_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_asub_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_asub_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_asub_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_asub_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_asub_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_asub_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}